

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::TaggedUnionExpression::fromSyntax
          (Compilation *compilation,TaggedUnionExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  ExpressionSyntax *rhs;
  string_view arg;
  Symbol *args_1;
  bool bVar1;
  Type *pTVar2;
  Scope *this;
  Diagnostic *pDVar3;
  Expression *pEVar4;
  SourceRange local_110;
  Compilation *local_100;
  TaggedUnionExpression *result;
  ConstantValue *local_f0;
  SourceRange local_e8;
  DiagCode local_d4;
  bitmask<slang::ast::ASTFlags> local_d0;
  Token local_c8;
  SourceLocation local_b8;
  Expression *local_b0;
  Expression *valueExpr;
  FieldSymbol *field;
  size_t local_98;
  SourceRange local_90;
  DiagCode local_7c;
  Diagnostic *local_78;
  Diagnostic *diag;
  size_t local_68;
  Symbol *local_60;
  Symbol *member;
  string_view memberName;
  Type *assignmentTarget_local;
  ASTContext *context_local;
  TaggedUnionExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  if ((assignmentTarget == (Type *)0x0) || (bVar1 = Type::isTaggedUnion(assignmentTarget), !bVar1))
  {
    if ((assignmentTarget == (Type *)0x0) || (bVar1 = Type::isError(assignmentTarget), !bVar1)) {
      join_0x00000010_0x00000000_ = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(context,(DiagCode)0x880007,join_0x00000010_0x00000000_);
    }
    compilation_local = (Compilation *)Expression::badExpr(compilation,(Expression *)0x0);
  }
  else {
    _member = parsing::Token::valueText(&syntax->member);
    pTVar2 = Type::getCanonicalType(assignmentTarget);
    this = Symbol::as<slang::ast::Scope>(&pTVar2->super_Symbol);
    diag = (Diagnostic *)member;
    local_68 = memberName._M_len;
    local_60 = Scope::find(this,_member);
    if (local_60 == (Symbol *)0x0) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&member);
      if (!bVar1) {
        local_7c.subsystem = Lookup;
        local_7c.code = 0x33;
        local_90 = parsing::Token::range(&syntax->member);
        local_78 = ASTContext::addDiag(context,local_7c,local_90);
        field = (FieldSymbol *)member;
        local_98 = memberName._M_len;
        pDVar3 = Diagnostic::operator<<(local_78,_member);
        ast::operator<<(pDVar3,assignmentTarget);
      }
      compilation_local = (Compilation *)Expression::badExpr(compilation,(Expression *)0x0);
    }
    else {
      valueExpr = (Expression *)Symbol::as<slang::ast::FieldSymbol>(local_60);
      local_b0 = (Expression *)0x0;
      if (syntax->expr == (ExpressionSyntax *)0x0) {
        pTVar2 = ValueSymbol::getType((ValueSymbol *)valueExpr);
        bVar1 = Type::isVoid(pTVar2);
        if (!bVar1) {
          local_d4.subsystem = Expressions;
          local_d4.code = 0x87;
          local_e8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          pDVar3 = ASTContext::addDiag(context,local_d4,local_e8);
          result = (TaggedUnionExpression *)(valueExpr->type).ptr;
          local_f0 = valueExpr->constant;
          arg._M_len = *(size_t *)&valueExpr->type;
          arg._M_str = (char *)valueExpr->constant;
          Diagnostic::operator<<(pDVar3,arg);
          pEVar4 = Expression::badExpr(compilation,(Expression *)0x0);
          return pEVar4;
        }
      }
      else {
        pTVar2 = ValueSymbol::getType((ValueSymbol *)valueExpr);
        rhs = syntax->expr;
        local_c8 = slang::syntax::SyntaxNode::getFirstToken(&syntax->expr->super_SyntaxNode);
        local_b8 = parsing::Token::location(&local_c8);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_d0,None);
        local_b0 = Expression::bindRValue(pTVar2,rhs,local_b8,context,local_d0);
      }
      args_1 = local_60;
      local_110 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      local_100 = (Compilation *)
                  BumpAllocator::
                  emplace<slang::ast::TaggedUnionExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::Expression_const*&,slang::SourceRange>
                            (&compilation->super_BumpAllocator,assignmentTarget,args_1,&local_b0,
                             &local_110);
      if ((local_b0 == (Expression *)0x0) || (bVar1 = Expression::bad(local_b0), !bVar1)) {
        compilation_local = local_100;
      }
      else {
        compilation_local = (Compilation *)Expression::badExpr(compilation,(Expression *)local_100);
      }
    }
  }
  return (Expression *)compilation_local;
}

Assistant:

Expression& TaggedUnionExpression::fromSyntax(Compilation& compilation,
                                              const TaggedUnionExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    if (!assignmentTarget || !assignmentTarget->isTaggedUnion()) {
        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::TaggedUnionTarget, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    auto memberName = syntax.member.valueText();
    auto member = assignmentTarget->getCanonicalType().as<Scope>().find(memberName);
    if (!member) {
        if (!memberName.empty()) {
            auto& diag = context.addDiag(diag::UnknownMember, syntax.member.range());
            diag << memberName << *assignmentTarget;
        }
        return badExpr(compilation, nullptr);
    }

    auto& field = member->as<FieldSymbol>();

    const Expression* valueExpr = nullptr;
    if (syntax.expr) {
        valueExpr = &bindRValue(field.getType(), *syntax.expr,
                                syntax.expr->getFirstToken().location(), context);
    }
    else if (!field.getType().isVoid()) {
        context.addDiag(diag::TaggedUnionMissingInit, syntax.sourceRange()) << field.name;
        return badExpr(compilation, nullptr);
    }

    auto result = compilation.emplace<TaggedUnionExpression>(*assignmentTarget, *member, valueExpr,
                                                             syntax.sourceRange());
    if (valueExpr && valueExpr->bad())
        return badExpr(compilation, result);

    return *result;
}